

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plus3.cpp
# Opt level: O0

void __thiscall Electron::Plus3::set_control_register(Plus3 *this,uint8_t control,uint8_t changes)

{
  Drive *pDVar1;
  uint8_t changes_local;
  uint8_t control_local;
  Plus3 *this_local;
  
  if ((changes & 3) != 0) {
    Storage::Disk::Controller::set_drive((Controller *)this,control & 3);
  }
  if ((changes & 4) != 0) {
    pDVar1 = Storage::Disk::Controller::get_drive((Controller *)this,0);
    Storage::Disk::Drive::set_head(pDVar1,(uint)((control & 4) != 0));
    pDVar1 = Storage::Disk::Controller::get_drive((Controller *)this,1);
    Storage::Disk::Drive::set_head(pDVar1,(uint)((control & 4) != 0));
  }
  if ((changes & 8) != 0) {
    Storage::Disk::MFMController::set_is_double_density
              ((MFMController *)this,(bool)(((control & 8) != 0 ^ 0xffU) & 1));
  }
  return;
}

Assistant:

void Plus3::set_control_register(uint8_t control, uint8_t changes) {
	if(changes&3) {
		set_drive(control&3);
	}

	// Select the side on both drives at once.
	if(changes & 0x04) {
		get_drive(0).set_head((control & 0x04) ? 1 : 0);
		get_drive(1).set_head((control & 0x04) ? 1 : 0);
	}

	if(changes & 0x08) set_is_double_density(!(control & 0x08));
}